

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall
HVectorBase<HighsCDouble>::saxpy<double,HighsCDouble>
          (HVectorBase<HighsCDouble> *this,double pivotX,HVectorBase<HighsCDouble> *pivot)

{
  bool bVar1;
  long in_RSI;
  HighsCDouble *in_RDI;
  HighsCDouble *this_00;
  HighsCDouble x1;
  HighsCDouble x0;
  HighsInt iRow;
  HighsInt k;
  HighsCDouble *pivotArray;
  HighsInt *pivotIndex;
  HighsInt pivotCount;
  HighsCDouble *workArray;
  HighsInt *workIndex;
  HighsInt workCount;
  HighsCDouble *in_stack_ffffffffffffff50;
  HighsCDouble local_a0;
  HighsCDouble local_90;
  HighsCDouble local_80;
  HighsCDouble local_70;
  double local_60;
  double local_58;
  int local_50;
  int local_4c;
  const_reference local_48;
  const_reference local_40;
  int local_34;
  reference local_30;
  reference local_28;
  int local_1c;
  long local_18;
  
  local_1c = *(int *)((long)&in_RDI->hi + 4);
  local_18 = in_RSI;
  local_28 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&in_RDI->lo,0);
  local_30 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 2),0);
  local_34 = *(int *)(local_18 + 4);
  local_40 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 8),0);
  local_48 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(local_18 + 0x20),0);
  for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
    local_50 = local_40[local_4c];
    local_60 = local_30[local_50].hi;
    local_58 = local_30[local_50].lo;
    local_80 = ::operator*((double)in_stack_ffffffffffffff50,in_RDI);
    local_70 = HighsCDouble::operator+(in_stack_ffffffffffffff50,in_RDI);
    HighsCDouble::HighsCDouble(&local_90,0.0);
    bVar1 = HighsCDouble::operator==(in_stack_ffffffffffffff50,in_RDI);
    if (bVar1) {
      local_28[local_1c] = local_50;
      local_1c = local_1c + 1;
    }
    abs((int)&local_70);
    in_stack_ffffffffffffff50 = this_00;
    bVar1 = HighsCDouble::operator<(this_00,(double)in_RDI);
    if (bVar1) {
      HighsCDouble::HighsCDouble(&local_a0,1e-50);
    }
    else {
      local_a0.hi = local_70.hi;
      local_a0.lo = local_70.lo;
    }
    local_30[local_50].hi = local_a0.hi;
    local_30[local_50].lo = local_a0.lo;
  }
  *(int *)((long)&in_RDI->hi + 4) = local_1c;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}